

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O0

void __thiscall iqnet::Socket::Socket(Socket *this)

{
  int iVar1;
  network_error *this_00;
  undefined4 local_4c;
  undefined1 local_45;
  int enable;
  allocator<char> local_31;
  string local_30;
  Socket *local_10;
  Socket *this_local;
  
  this->_vptr_Socket = (_func_int **)&PTR__Socket_00254428;
  local_10 = this;
  Inet_addr::Inet_addr(&this->peer);
  iVar1 = socket(2,1,6);
  this->sock = iVar1;
  if (iVar1 == -1) {
    local_45 = 1;
    this_00 = (network_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Socket::Socket",&local_31);
    network_error::network_error(this_00,&local_30,true,0);
    local_45 = 0;
    __cxa_throw(this_00,&network_error::typeinfo,network_error::~network_error);
  }
  local_4c = 1;
  setsockopt(this->sock,1,2,&local_4c,4);
  return;
}

Assistant:

Socket::Socket()
{
  if( (sock = socket( PF_INET, SOCK_STREAM, IPPROTO_TCP )) == -1 )
    throw network_error( "Socket::Socket" );

#ifndef WIN32
  {
  int enable = 1;
  setsockopt( sock, SOL_SOCKET, SO_REUSEADDR, &enable, sizeof(enable) );
  }
#endif //WIN32

#if defined(__APPLE__)
  {
  int enable = 1;
  setsockopt( sock, SOL_SOCKET, SO_NOSIGPIPE, &enable, sizeof(enable) );
  }
#endif
}